

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Detonation_PDU::SetDescriptor(Detonation_PDU *this,DescPtr *D)

{
  Descriptor *pDVar1;
  long lVar2;
  byte bVar3;
  
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,D);
  pDVar1 = (this->m_pDescriptor).m_pRef;
  if (pDVar1 == (Descriptor *)0x0) {
    (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 =
         (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 0xfc | 2;
  }
  else {
    lVar2 = __dynamic_cast(pDVar1,&DATA_TYPE::Descriptor::typeinfo,
                           &DATA_TYPE::MunitionDescriptor::typeinfo,0);
    bVar3 = (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 0xfc;
    if (lVar2 != 0) {
      (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 = bVar3;
      return;
    }
    (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 = bVar3 | 1;
  }
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

void Detonation_PDU::SetDescriptor( DescPtr D )
{
    m_pDescriptor = D;

    #if DIS_VERSION > 6

    // Determine the FTI
    if( dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
    {
        m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI = MunitionDTI;
    }
    else if( dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
    {
        m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI = ExpendableDTI;
        m_ui8ProtocolVersion = IEEE_1278_1_2012; // We are using a DIS 7 feature now.
    }
    else
    {
        m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI = NonMunitionExplosionDTI;
        m_ui8ProtocolVersion = IEEE_1278_1_2012; // We are using a DIS 7 feature now.
    }

    #endif
}